

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Detonation_PDU::Detonation_PDU(Detonation_PDU *this)

{
  MunitionDescriptor *this_00;
  DescPtr local_48;
  
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_00216430;
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_LocationWorldCoords);
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00216488;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  DATA_TYPE::Vector::Vector(&this->m_LocationEntityCoords);
  this->m_ui8NumOfVariableParams = '\0';
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x03';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  this_00 = (MunitionDescriptor *)operator_new(0x20);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(this_00);
  local_48._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00216488;
  local_48.m_pRef = (Descriptor *)this_00;
  local_48.m_piCount = (RefCounter *)operator_new(2);
  *local_48.m_piCount = 1;
  SetDescriptor(this,&local_48);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_48);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU() :
    m_ui8NumOfVariableParams( 0 )
{
    m_ui8PDUType = Detonation_PDU_Type;
    m_ui16PDULength = DETONATION_PDU_SIZE;
    SetDescriptor( DescPtr( new MunitionDescriptor() ) );
}